

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

uint __thiscall
cimg_library::CImg<unsigned_int>::_atXYZC(CImg<unsigned_int> *this,int x,int y,int z,int c)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  uVar1 = this->_width;
  uVar2 = this->_height;
  iVar7 = uVar1 - 1;
  if (x < (int)uVar1) {
    iVar7 = x;
  }
  iVar6 = 0;
  if (x < 0) {
    iVar7 = iVar6;
  }
  iVar5 = uVar2 - 1;
  if (y < (int)uVar2) {
    iVar5 = y;
  }
  if (y < 0) {
    iVar5 = iVar6;
  }
  uVar3 = this->_depth;
  iVar4 = uVar3 - 1;
  if (z < (int)uVar3) {
    iVar4 = z;
  }
  if (z < 0) {
    iVar4 = iVar6;
  }
  iVar8 = this->_spectrum - 1;
  if (c < (int)this->_spectrum) {
    iVar8 = c;
  }
  if (c < 0) {
    iVar8 = iVar6;
  }
  return this->_data[((iVar8 * uVar3 + iVar4) * uVar2 + iVar5) * uVar1 + iVar7];
}

Assistant:

T _atXYZC(const int x, const int y, const int z, const int c) const {
      return (*this)(x<0?0:(x>=width()?width()-1:x), y<0?0:(y>=height()?height()-1:y),
                     z<0?0:(z>=depth()?depth()-1:z), c<0?0:(c>=spectrum()?spectrum()-1:c));
    }